

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O1

HTS_Boolean HTS_ModelSet_get_gv_flag(HTS_ModelSet *ms,char *string)

{
  HTS_Boolean HVar1;
  HTS_Question *pHVar2;
  bool bVar3;
  
  pHVar2 = ms->gv_off_context;
  if (pHVar2 == (HTS_Question *)0x0) {
    bVar3 = true;
  }
  else {
    do {
      pHVar2 = (HTS_Question *)pHVar2->head;
      if (pHVar2 == (HTS_Question *)0x0) break;
      HVar1 = HTS_pattern_match(string,pHVar2->string);
    } while (HVar1 == '\0');
    bVar3 = pHVar2 == (HTS_Question *)0x0;
  }
  return bVar3;
}

Assistant:

HTS_Boolean HTS_ModelSet_get_gv_flag(HTS_ModelSet * ms, const char *string)
{
   if (ms->gv_off_context == NULL)
      return TRUE;
   else if (HTS_Question_match(ms->gv_off_context, string) == TRUE)
      return FALSE;
   else
      return TRUE;
}